

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

storage_t Test<unsigned_int,_unsigned_int,_double>::median
                    (vector<double,_std::allocator<double>_> *values)

{
  storage_t sVar1;
  vector<double,_std::allocator<double>_> sortvalues;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,values);
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_20._M_impl.super__Vector_impl_data._M_start,
             (double *)
             (((long)local_20._M_impl.super__Vector_impl_data._M_finish -
               (long)local_20._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U) +
             (long)local_20._M_impl.super__Vector_impl_data._M_start),
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_20._M_impl.super__Vector_impl_data._M_finish);
  sVar1 = *(storage_t *)
           ((long)local_20._M_impl.super__Vector_impl_data._M_start +
           ((long)local_20._M_impl.super__Vector_impl_data._M_finish -
            (long)local_20._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return sVar1;
}

Assistant:

static storage_t median(const std::vector<storage_t>& values)
    {
        std::vector<storage_t> sortvalues = values;
        std::nth_element(sortvalues.begin(), sortvalues.begin() + sortvalues.size() / 2, sortvalues.end());
        auto medianIt = sortvalues.cbegin() + sortvalues.size() / 2;
        return *medianIt;
    }